

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIHexValueImpl::~FIHexValueImpl(FIHexValueImpl *this)

{
  (this->super_FIHexValue).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008d4878;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIByteValue::~FIByteValue((FIByteValue *)this);
  return;
}

Assistant:

inline FIHexValueImpl(std::vector<uint8_t> &&value_):  strValueValid(false) { value = std::move(value_); }